

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readthis.cpp
# Opt level: O2

bool __thiscall DReadThisMenu::MenuEvent(DReadThisMenu *this,int mkey,bool fromcontroller)

{
  int iVar1;
  bool bVar2;
  FSoundID local_c;
  
  if (mkey == 6) {
    local_c.ID = S_FindSound("menu/choose");
    S_Sound(0x22,&local_c,snd_menuvolume.Value,0.0);
    iVar1 = this->mScreen;
    this->mScreen = iVar1 + 1;
    this->mInfoTic = gametic;
    if (((level.info != (level_info_t *)0x0) && (*(int *)(((level.info)->F1Pic).Chars + -0xc) != 0))
       || ((int)gameinfo.infoPages.Count <= iVar1)) {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
    }
    return true;
  }
  bVar2 = DMenu::MenuEvent(&this->super_DMenu,mkey,fromcontroller);
  return bVar2;
}

Assistant:

bool DReadThisMenu::MenuEvent(int mkey, bool fromcontroller)
{
	if (mkey == MKEY_Enter)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		mScreen++;
		mInfoTic = gametic;
		if ((level.info != NULL && level.info->F1Pic.Len() != 0) || mScreen > int(gameinfo.infoPages.Size()))
		{
			Close();
		}
		return true;
	}
	else return Super::MenuEvent(mkey, fromcontroller);
}